

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O2

void __thiscall Iir::BiquadPoleState::BiquadPoleState(BiquadPoleState *this,Biquad *s)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double local_18 [2];
  
  *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value + 8) = 0;
  this->gain = 1.0;
  dVar1 = s->m_a0;
  dVar16 = s->m_a1 * dVar1;
  dVar6 = s->m_a2 * dVar1;
  dVar10 = s->m_b0 * dVar1;
  dVar14 = s->m_b1 * dVar1;
  dVar15 = s->m_b2 * dVar1;
  if ((((dVar6 != 0.0) || (NAN(dVar6))) || (dVar15 != 0.0)) || (NAN(dVar15))) {
    dVar6 = dVar1 * -4.0 * dVar6;
    local_18[0] = dVar16 * dVar16 + dVar6;
    local_18[1] = 0.0;
    std::sqrt<double>((complex<double> *)local_18);
    auVar11._0_8_ = -(dVar16 + extraout_XMM0_Qa);
    auVar11._8_8_ = -dVar6;
    dVar9 = dVar1 + dVar1;
    auVar12._8_8_ = dVar9;
    auVar12._0_8_ = dVar9;
    auVar12 = divpd(auVar11,auVar12);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value =
         auVar12;
    auVar7._0_8_ = extraout_XMM0_Qa - dVar16;
    auVar7._8_8_ = dVar6;
    auVar2._8_8_ = dVar9;
    auVar2._0_8_ = dVar9;
    auVar12 = divpd(auVar7,auVar2);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value =
         auVar12;
    bVar5 = ComplexPair::is_nan((ComplexPair *)this);
    if (bVar5) {
      throw_invalid_argument("poles are NaN");
    }
    dVar6 = dVar14 * dVar14 + dVar10 * -4.0 * dVar15;
    local_18[1] = 0.0;
    local_18[0] = dVar6;
    std::sqrt<double>((complex<double> *)local_18);
    dVar15 = dVar10 + dVar10;
    auVar13._0_8_ = -(dVar14 + extraout_XMM0_Qa_00);
    auVar13._8_8_ = -dVar6;
    auVar3._8_8_ = dVar15;
    auVar3._0_8_ = dVar15;
    auVar12 = divpd(auVar13,auVar3);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value =
         auVar12;
    auVar8._0_8_ = extraout_XMM0_Qa_00 - dVar14;
    auVar8._8_8_ = dVar6;
    auVar4._8_8_ = dVar15;
    auVar4._0_8_ = dVar15;
    auVar12 = divpd(auVar8,auVar4);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value =
         auVar12;
    bVar5 = ComplexPair::is_nan(&(this->super_PoleZeroPair).zeros);
    if (bVar5) {
      throw_invalid_argument("zeros are NaN");
    }
  }
  else {
    *(double *)(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value = -dVar16;
    *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value + 8) = 0;
    *(double *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value =
         -dVar10 / dVar14;
    *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value = 0;
    *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value + 8) = 0;
    *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value + 8) = 0;
    *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value = 0;
    *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value + 8) = 0;
  }
  this->gain = dVar10 / dVar1;
  return;
}

Assistant:

BiquadPoleState::BiquadPoleState (const Biquad& s)
	{
		const double a0 = s.getA0 ();
		const double a1 = s.getA1 ();
		const double a2 = s.getA2 ();
		const double b0 = s.getB0 ();
		const double b1 = s.getB1 ();
		const double b2 = s.getB2 ();

		if (a2 == 0 && b2 == 0)
		{
			// single pole
			poles.first = -a1;
			zeros.first = -b0 / b1;
			poles.second = 0;
			zeros.second = 0;
		}
		else
		{
			{
				const complex_t c = sqrt (complex_t (a1 * a1 - 4 * a0 * a2, 0));
				double d = 2. * a0;
				poles.first = -(a1 + c) / d;
				poles.second =  (c - a1) / d;
				if (poles.is_nan()) throw_invalid_argument("poles are NaN");
			}

			{
				const complex_t c = sqrt (complex_t (
								  b1 * b1 - 4 * b0 * b2, 0));
				double d = 2. * b0;
				zeros.first = -(b1 + c) / d;
				zeros.second =  (c - b1) / d;
				if (zeros.is_nan()) throw_invalid_argument("zeros are NaN");
			}
		}

		gain = b0 / a0;
	}